

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl_util.h
# Opt level: O2

void google::protobuf::
     STLDeleteElements<std::vector<google::protobuf::FileDescriptorTables*,std::allocator<google::protobuf::FileDescriptorTables*>>>
               (vector<google::protobuf::FileDescriptorTables_*,_std::allocator<google::protobuf::FileDescriptorTables_*>_>
                *container)

{
  pointer ppFVar1;
  
  if (container !=
      (vector<google::protobuf::FileDescriptorTables_*,_std::allocator<google::protobuf::FileDescriptorTables_*>_>
       *)0x0) {
    STLDeleteContainerPointers<__gnu_cxx::__normal_iterator<google::protobuf::FileDescriptorTables**,std::vector<google::protobuf::FileDescriptorTables*,std::allocator<google::protobuf::FileDescriptorTables*>>>>
              ((__normal_iterator<google::protobuf::FileDescriptorTables_**,_std::vector<google::protobuf::FileDescriptorTables_*,_std::allocator<google::protobuf::FileDescriptorTables_*>_>_>
                )(container->
                 super__Vector_base<google::protobuf::FileDescriptorTables_*,_std::allocator<google::protobuf::FileDescriptorTables_*>_>
                 )._M_impl.super__Vector_impl_data._M_start,
               (__normal_iterator<google::protobuf::FileDescriptorTables_**,_std::vector<google::protobuf::FileDescriptorTables_*,_std::allocator<google::protobuf::FileDescriptorTables_*>_>_>
                )(container->
                 super__Vector_base<google::protobuf::FileDescriptorTables_*,_std::allocator<google::protobuf::FileDescriptorTables_*>_>
                 )._M_impl.super__Vector_impl_data._M_finish);
    ppFVar1 = (container->
              super__Vector_base<google::protobuf::FileDescriptorTables_*,_std::allocator<google::protobuf::FileDescriptorTables_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
    if ((container->
        super__Vector_base<google::protobuf::FileDescriptorTables_*,_std::allocator<google::protobuf::FileDescriptorTables_*>_>
        )._M_impl.super__Vector_impl_data._M_finish != ppFVar1) {
      (container->
      super__Vector_base<google::protobuf::FileDescriptorTables_*,_std::allocator<google::protobuf::FileDescriptorTables_*>_>
      )._M_impl.super__Vector_impl_data._M_finish = ppFVar1;
    }
  }
  return;
}

Assistant:

void STLDeleteElements(T *container) {
  if (!container) return;
  STLDeleteContainerPointers(container->begin(), container->end());
  container->clear();
}